

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxKeyboard.cpp
# Opt level: O3

void __thiscall OIS::LinuxKeyboard::_handleKeyPress(LinuxKeyboard *this,XEvent *event)

{
  TextTranslationMode TVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint text;
  value_type *__val;
  iterator iVar5;
  pointer pcVar6;
  KeyCode kc;
  int status;
  KeySym keySym;
  key_type_conflict local_48;
  key_type_conflict local_40;
  int local_34;
  
  if ((_handleKeyPress(_XEvent&)::buf == '\0') &&
     (iVar3 = __cxa_guard_acquire(&_handleKeyPress(_XEvent&)::buf), iVar3 != 0)) {
    _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar6 = (pointer)operator_new(0x20);
    _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar6 + 0x20;
    _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = pcVar6;
    _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pcVar6[0x10] = '\0';
    pcVar6[0x11] = '\0';
    pcVar6[0x12] = '\0';
    pcVar6[0x13] = '\0';
    pcVar6[0x14] = '\0';
    pcVar6[0x15] = '\0';
    pcVar6[0x16] = '\0';
    pcVar6[0x17] = '\0';
    pcVar6[0x18] = '\0';
    pcVar6[0x19] = '\0';
    pcVar6[0x1a] = '\0';
    pcVar6[0x1b] = '\0';
    pcVar6[0x1c] = '\0';
    pcVar6[0x1d] = '\0';
    pcVar6[0x1e] = '\0';
    pcVar6[0x1f] = '\0';
    pcVar6[0] = '\0';
    pcVar6[1] = '\0';
    pcVar6[2] = '\0';
    pcVar6[3] = '\0';
    pcVar6[4] = '\0';
    pcVar6[5] = '\0';
    pcVar6[6] = '\0';
    pcVar6[7] = '\0';
    pcVar6[8] = '\0';
    pcVar6[9] = '\0';
    pcVar6[10] = '\0';
    pcVar6[0xb] = '\0';
    pcVar6[0xc] = '\0';
    pcVar6[0xd] = '\0';
    pcVar6[0xe] = '\0';
    pcVar6[0xf] = '\0';
    __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&_handleKeyPress::buf,
                 &__dso_handle);
    __cxa_guard_release(&_handleKeyPress(_XEvent&)::buf);
  }
  iVar3 = XFilterEvent(event,0);
  if (this->xic == (XIC)0x0) {
    iVar4 = XLookupString(event,_handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                          ~(uint)_handleKeyPress::buf.
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start +
                          (int)_handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_finish,&local_40,0);
    _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start[iVar4] = '\0';
  }
  else {
    local_34 = iVar3;
    do {
      iVar4 = Xutf8LookupString(this->xic,event,
                                _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                ~(uint)_handleKeyPress::buf.
                                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                       super__Vector_impl_data._M_start +
                                (int)_handleKeyPress::buf.
                                     super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_finish,&local_40,&local_48);
      _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[iVar4] = '\0';
      iVar3 = local_34;
      if ((int)local_48 != -1) break;
      std::vector<char,_std::allocator<char>_>::resize
                (&_handleKeyPress::buf,
                 ((long)_handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl
                        .super__Vector_impl_data._M_finish -
                 (long)_handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start) * 2);
      iVar3 = local_34;
    } while ((int)local_48 == -1);
  }
  text = 0;
  if ((iVar3 == 0) && (0 < iVar4)) {
    TVar1 = (this->super_Keyboard).mTextMode;
    if (TVar1 == Ascii) {
      text = (uint)*_handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
    else if (TVar1 == Unicode) {
      text = UTF8ToUTF32((uchar *)_handleKeyPress::buf.
                                  super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
    }
  }
  (this->super_Keyboard).mModifiers =
       (uint)((this->numLockMask & (event->xkey).state) != 0) << 0x10 |
       (uint)((this->capsLockMask & (event->xkey).state) != 0) << 0xc |
       (this->super_Keyboard).mModifiers & 0xfffeefff;
  local_48 = local_40;
  kc = KC_UNASSIGNED;
  if (local_40 != 0) {
    iVar5 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_OIS::KeyCode>,_std::allocator<std::pair<const_unsigned_long,_OIS::KeyCode>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->keyConversionToOIS)._M_h,&local_48);
    if (iVar5.super__Node_iterator_base<std::pair<const_unsigned_long,_OIS::KeyCode>,_false>._M_cur
        == (__node_type *)0x0) {
      bVar2 = XKeysymToKeycode(this->display,local_48);
      kc = KC_UNASSIGNED;
      if (8 < bVar2) {
        kc = bVar2 - KC_7;
      }
    }
    else {
      kc = *(KeyCode *)
            ((long)iVar5.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_OIS::KeyCode>,_false>.
                   _M_cur + 0x10);
    }
  }
  _injectKeyDown(this,kc,text);
  if ((((event->xkey).state & 8) != 0) && (local_40 == 0xff09)) {
    *(undefined1 *)
     ((long)&(this->super_Keyboard).super_Object.mCreator[1].mFactories.
             super__Vector_base<OIS::FactoryCreator_*,_std::allocator<OIS::FactoryCreator_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  }
  return;
}

Assistant:

void LinuxKeyboard::_handleKeyPress(XEvent& event)
{
	XKeyEvent& e = (XKeyEvent&)event;
	static std::vector<char> buf(32);
	KeySym keySym;
	unsigned int character = 0;
	int bytes			   = 0;
	bool haveChar		   = true;

	haveChar = !XFilterEvent(&event, None);

	if(xic)
	{
		Status status;
		do
		{
			bytes	   = Xutf8LookupString(xic, &e, &buf[0], buf.size() - 1, &keySym, &status);
			buf[bytes] = '\0';

			if(status == XBufferOverflow)
				buf.resize(buf.size() * 2);
		} while(status == XBufferOverflow);
	}
	else
	{
		bytes	   = XLookupString(&e, &buf[0], buf.size() - 1, &keySym, NULL);
		buf[bytes] = '\0';
	}

	if(haveChar && bytes > 0)
	{
		if(mTextMode == Unicode)
			character = UTF8ToUTF32(reinterpret_cast<unsigned char*>(&buf[0]));
		else if(mTextMode == Ascii)
			character = buf[0];
	}

	if(e.state & capsLockMask)
		mModifiers |= CapsLock;
	else
		mModifiers &= ~CapsLock;

	if(e.state & numLockMask)
		mModifiers |= NumLock;
	else
		mModifiers &= ~NumLock;

	KeyCode kc = KeySymToOISKeyCode(keySym);
	_injectKeyDown(kc, character);

	//Check for Alt-Tab
	LinuxInputManager* linMan = static_cast<LinuxInputManager*>(mCreator);
	if((e.state & Mod1Mask) && (keySym == XK_Tab))
		linMan->_setGrabState(false);
}